

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

void __thiscall
RuntimeObjectSystem::SetupObjectConstructors
          (RuntimeObjectSystem *this,IPerModuleInterface *pPerModuleInterface)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  AUDynArray<IObjectConstructor_*> constructors;
  IAUDynArray<IObjectConstructor_*> local_30;
  long *plVar2;
  
  (*pPerModuleInterface->_vptr_IPerModuleInterface[2])(pPerModuleInterface,this->m_pSystemTable);
  (*pPerModuleInterface->_vptr_IPerModuleInterface[3])(pPerModuleInterface,this);
  iVar1 = (**pPerModuleInterface->_vptr_IPerModuleInterface)(pPerModuleInterface);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  AUDynArray<IObjectConstructor_*>::AUDynArray
            ((AUDynArray<IObjectConstructor_*> *)&local_30,plVar2[1] - *plVar2 >> 3);
  if (plVar2[1] - *plVar2 != 0) {
    lVar3 = plVar2[1] - *plVar2 >> 3;
    lVar4 = 0;
    do {
      local_30.m_vec.super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar4] =
           *(IObjectConstructor **)(*plVar2 + lVar4 * 8);
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (this->m_bAutoCompile != false) {
    SetupRuntimeFileTracking(this,&local_30);
  }
  (*this->m_pObjectFactorySystem->_vptr_IObjectFactorySystem[3])
            (this->m_pObjectFactorySystem,&local_30);
  AUDynArray<IObjectConstructor_*>::~AUDynArray((AUDynArray<IObjectConstructor_*> *)&local_30);
  return;
}

Assistant:

void RuntimeObjectSystem::SetupObjectConstructors(IPerModuleInterface* pPerModuleInterface)
{
    // Set system Table
    pPerModuleInterface->SetSystemTable( m_pSystemTable );
    pPerModuleInterface->SetRuntimeObjectSystem( this );

	// get hold of the constructors
	const std::vector<IObjectConstructor*> &objectConstructors = pPerModuleInterface->GetConstructors();
	AUDynArray<IObjectConstructor*> constructors(objectConstructors.size());
	for (size_t i = 0, iMax = objectConstructors.size(); i < iMax; ++i)
	{
		constructors[i] = objectConstructors[i];
	}

	if (m_bAutoCompile)
	{
		SetupRuntimeFileTracking(constructors);
	}

	m_pObjectFactorySystem->AddConstructors(constructors);

}